

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void sprintf<char_const*,char_const*>(stringstream *oss,string *fmt,char *value,char *args)

{
  ostream *poVar1;
  ostream *poVar2;
  byte bVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  ostream oVar10;
  runtime_error *prVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  undefined1 auVar19 [12];
  string local_70;
  char *local_50 [2];
  char *local_40;
  char *local_38;
  
  bVar18 = fmt->_M_string_length != 0;
  local_40 = value;
  local_38 = args;
  if (bVar18) {
    poVar1 = (ostream *)(oss + 0x10);
    uVar14 = 0;
    do {
      pcVar5 = (fmt->_M_dataplus)._M_p;
      uVar15 = uVar14;
      if ((pcVar5[uVar14] == '%') && (uVar15 = uVar14 + 1, pcVar5[uVar14 + 1] != '%')) {
        uVar14 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar15);
        if (uVar14 <= uVar15) {
          bVar9 = false;
          uVar16 = uVar15;
          goto LAB_00118b37;
        }
        bVar9 = false;
        goto LAB_00118a5e;
      }
      local_70._M_dataplus._M_p._0_1_ = pcVar5[uVar15];
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_70,1);
      uVar14 = uVar15 + 1;
      bVar18 = uVar14 < fmt->_M_string_length;
    } while (bVar18);
  }
  goto LAB_001189fd;
LAB_00118a5e:
  do {
    bVar3 = (fmt->_M_dataplus)._M_p[uVar15];
    uVar16 = uVar15;
    if (bVar3 < 0x2b) {
      if (bVar3 != 0x20) {
        if (bVar3 != 0x23) break;
        bVar9 = true;
      }
    }
    else if (bVar3 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar3 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar3 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar2 = poVar1 + *(long *)(*(long *)poVar1 + -0x18);
        if (oss[*(long *)(*(long *)poVar1 + -0x18) + 0xf1] == (stringstream)0x0) {
          oVar10 = (ostream)std::ios::widen((char)poVar2);
          poVar2[0xe0] = oVar10;
          poVar2[0xe1] = (ostream)0x1;
        }
        poVar2[0xe0] = (ostream)0x30;
      }
    }
    uVar15 = uVar15 + 1;
    uVar16 = uVar14;
  } while (uVar14 != uVar15);
LAB_00118b37:
  std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
  pcVar8 = (char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p);
  piVar12 = __errno_location();
  iVar4 = *piVar12;
  *piVar12 = 0;
  lVar13 = strtol(pcVar8,local_50,10);
  pcVar17 = local_50[0];
  if (local_50[0] == pcVar8) {
    std::__throw_invalid_argument("stoi");
LAB_00118d8d:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar13 - 0x80000000U < 0xffffffff00000000) || (*piVar12 == 0x22)) goto LAB_00118d8d;
    if (*piVar12 == 0) {
      *piVar12 = iVar4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                      local_70.field_2._M_allocated_capacity + 1);
    }
    *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x20) = (long)(int)lVar13;
    pcVar17 = pcVar17 + (uVar16 - (long)pcVar8);
    lVar13 = 0;
    if (pcVar17[(long)(fmt->_M_dataplus)._M_p] != '.') {
LAB_00118cd1:
      if ((byte)(pcVar17[(long)(fmt->_M_dataplus)._M_p] | 0x20U) == 0x78) {
        lVar6 = *(long *)(oss + 0x10);
        lVar7 = *(long *)(lVar6 + -0x18);
        *(uint *)(oss + lVar7 + 0x28) = *(uint *)(oss + lVar7 + 0x28) & 0xffffffb5 | 8;
        if (bVar9) {
          *(uint *)(oss + *(long *)(lVar6 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar6 + -0x18) + 0x28) | 0x200;
        }
      }
      streamout(oss,local_40,(int)lVar13);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
      sprintf<char_const*>(oss,&local_70,local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar18) {
        return;
      }
LAB_001189fd:
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"extra arguments provided to sprintf");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
    pcVar8 = (char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p);
    piVar12 = __errno_location();
    iVar4 = *piVar12;
    *piVar12 = 0;
    lVar13 = strtol(pcVar8,local_50,10);
    if (local_50[0] != pcVar8) {
      if ((lVar13 - 0x80000000U < 0xffffffff00000000) || (*piVar12 == 0x22)) goto LAB_00118da5;
      if (*piVar12 == 0) {
        *piVar12 = iVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      pcVar17 = local_50[0] + (long)(pcVar17 + (1 - (long)pcVar8));
      goto LAB_00118cd1;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00118da5:
  auVar19 = std::__throw_out_of_range("stoi");
  if (auVar19._8_4_ != 1) {
    _Unwind_Resume(auVar19._0_8_);
  }
  __cxa_begin_catch(auVar19._0_8_);
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar11,"Expected precision value in sprintf");
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}